

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_attention.h
# Opt level: O0

void __thiscall
shift_window_transformer::WindowAttention<float>::reArrange
          (WindowAttention<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  initializer_list<int> __l;
  int iVar14;
  Tensor<float> *this_00;
  int iVar15;
  int iVar16;
  size_type sVar17;
  const_reference pvVar18;
  const_reference pvVar19;
  reference pvVar20;
  int iVar21;
  int d;
  int c;
  int b;
  int a;
  int k;
  int j;
  int i;
  int key_a;
  int key_b;
  int key_c;
  int lock_i;
  int lock_j;
  int local_50;
  int local_4c;
  iterator local_48;
  undefined8 local_40;
  int local_34;
  int local_30;
  int dim;
  int nw_w;
  int nw_h;
  int n_w;
  int n_h;
  Tensor<float> *output_local;
  Tensor<float> *input_local;
  WindowAttention<float> *this_local;
  
  _n_w = output;
  output_local = input;
  input_local = (Tensor<float> *)this;
  sVar17 = std::vector<int,_std::allocator<int>_>::size(&input->shape);
  if (sVar17 == 3) {
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&output_local->shape,0);
    nw_h = *pvVar18;
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&output_local->shape,1);
    nw_w = *pvVar18;
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&output_local->shape,0);
    dim = *pvVar18 / this->windowSize;
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&output_local->shape,1);
    local_30 = *pvVar18 / this->windowSize;
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&output_local->shape,2);
    local_4c = *pvVar18 / this->heads;
    lock_i = this->heads;
    lock_j = dim * local_30;
    local_50 = this->windowSize * this->windowSize;
    local_48 = &lock_i;
    local_40 = 4;
    __l._M_len = 4;
    __l._M_array = local_48;
    local_34 = local_4c;
    std::vector<int,_std::allocator<int>_>::operator=(&_n_w->shape,__l);
    this_00 = _n_w;
    sVar17 = std::vector<float,_std::allocator<float>_>::size
                       (&output_local->super_vector<float,_std::allocator<float>_>);
    std::vector<float,_std::allocator<float>_>::resize
              (&this_00->super_vector<float,_std::allocator<float>_>,sVar17);
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&output_local->shape,2);
    iVar2 = *pvVar18;
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&output_local->shape,1);
    iVar14 = local_34;
    iVar3 = *pvVar18;
    iVar15 = local_34 * this->windowSize;
    iVar4 = this->windowSize;
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&output_local->shape,0);
    iVar5 = *pvVar18;
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&output_local->shape,1);
    iVar6 = *pvVar18;
    for (k = 0; k < nw_h; k = k + 1) {
      for (a = 0; a < nw_w; a = a + 1) {
        b = 0;
        while( true ) {
          pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&output_local->shape,2);
          if (*pvVar18 <= b) break;
          iVar16 = b / local_34;
          iVar7 = this->windowSize;
          pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&output_local->shape,0);
          iVar8 = *pvVar18;
          iVar9 = this->windowSize;
          iVar10 = this->windowSize;
          iVar11 = this->windowSize;
          iVar12 = this->windowSize;
          iVar13 = this->windowSize;
          iVar21 = b % local_34;
          pvVar19 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&output_local->super_vector<float,_std::allocator<float>_>,
                               (long)(k * iVar2 * iVar3 + a * iVar2 + b));
          vVar1 = *pvVar19;
          pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&_n_w->super_vector<float,_std::allocator<float>_>,
                               (long)(iVar16 * iVar14 * iVar5 * iVar6 +
                                      ((k / iVar7) * (iVar8 / iVar9) + a / iVar10) * iVar15 * iVar4
                                      + ((k % iVar11) * iVar12 + a % iVar13) * iVar14 + iVar21));
          *pvVar20 = vVar1;
          b = b + 1;
        }
      }
    }
    return;
  }
  __assert_fail("input.shape.size() == 3",
                "/workspace/llm4binary/github/license_c_cmakelists/dianhsu[P]swin-transformer-cpp/model/window_attention.h"
                ,0x42,
                "void shift_window_transformer::WindowAttention<float>::reArrange(const Tensor<T> &, Tensor<T> &) [T = float]"
               );
}

Assistant:

void reArrange(const Tensor<T> &input, Tensor<T> &output) {
            assert(input.shape.size() == 3);
            int n_h = input.shape[0], n_w = input.shape[1];
            int nw_h = input.shape[0] / windowSize, nw_w = input.shape[1] / windowSize;
            int dim = input.shape[2] / heads;
            output.shape = {heads, nw_h * nw_w, windowSize * windowSize, dim};
            output.resize(input.size());
            int lock_j = input.shape[2];
            int lock_i = lock_j * input.shape[1];
            int key_c = dim;
            int key_b = key_c * windowSize * windowSize;
            int key_a = key_c * input.shape[0] * input.shape[1];
            for (int i = 0; i < n_h; ++i) {
                for (int j = 0; j < n_w; ++j) {
                    for (int k = 0; k < input.shape[2]; ++k) {
                        int a = k / dim;
                        int b = i / windowSize * (input.shape[0] / windowSize) + j / windowSize;
                        int c = i % windowSize * windowSize + j % windowSize;
                        int d = k % dim;
                        output[a * key_a + b * key_b + c * key_c + d] = input[i * lock_i + j * lock_j + k];
                    }
                }
            }
        }